

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_xc_br3p86.c
# Opt level: O2

void hyb_mgga_xc_br3p86_init(xc_func_type *p)

{
  xc_mix_init(p,4,hyb_mgga_xc_br3p86_init::funcs_id,hyb_mgga_xc_br3p86_init::funcs_coef);
  xc_hyb_init_hybrid(p,0.0);
  return;
}

Assistant:

static void
hyb_mgga_xc_br3p86_init(xc_func_type *p)
{
  /*
    The functional form is not fully described in the Neumann-Handy
    paper; however, they state they use VWN correlation; also the P86
    correction is on top of VWN. According to Aron Cohen, the version
    of VWN in CADPAC is version 5, which is LDA_C_VWN in libxc.
   */

  static int   funcs_id   [4] = {XC_LDA_X, XC_MGGA_X_BR89_1, XC_LDA_C_VWN, XC_GGA_C_P86VWN};
  static double funcs_coef[4] = {0.0, 0.0, 0.0, 0.0}; /* initialized by ext_params */

  xc_mix_init(p, 4, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, 0.0);  /* initialized by ext_params */
}